

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightVectorPhrase.cpp
# Opt level: O2

double __thiscall wv::WeightVectorPhrase::calcDistance(WeightVectorPhrase *this,Point *p)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  undefined8 *puVar6;
  _func_int **pp_Var7;
  key_type local_60;
  double local_40;
  uint local_34;
  
  if (p == (Point *)0x0) {
    __cxa_bad_typeid();
  }
  else {
    pp_Var7 = (this->super_AbstractWeightVector)._vptr_AbstractWeightVector;
    iVar1 = strcmp(*(char **)(p->_vptr_AbstractWeightVector[-1] + 8) +
                   (**(char **)(p->_vptr_AbstractWeightVector[-1] + 8) == '*'),
                   *(char **)(pp_Var7[-1] + 8) + (**(char **)(pp_Var7[-1] + 8) == '*'));
    if (iVar1 == 0) {
      uVar3 = 0;
      local_40 = 0.0;
      while( true ) {
        uVar2 = (*pp_Var7[3])(this);
        if (uVar2 <= uVar3) break;
        uVar2 = 0;
        local_34 = uVar3;
        while( true ) {
          uVar3 = (*p->_vptr_AbstractWeightVector[3])(p);
          if (uVar3 <= uVar2) break;
          this_00 = &this->m_Distances->_M_h;
          (*(this->super_AbstractWeightVector)._vptr_AbstractWeightVector[2])
                    (&local_60,this,(ulong)local_34);
          cVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(this_00,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          if (cVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            (*p->_vptr_AbstractWeightVector[2])(&local_60,p,(ulong)uVar2);
            cVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)((long)cVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_true>
                                     ._M_cur + 0x28),&local_60);
            std::__cxx11::string::~string((string *)&local_60);
            if (cVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_40 = local_40 +
                         *(double *)
                          ((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                 ._M_cur + 0x28);
            }
          }
          uVar2 = uVar2 + 1;
        }
        uVar3 = local_34 + 1;
        pp_Var7 = (this->super_AbstractWeightVector)._vptr_AbstractWeightVector;
      }
      return 5.0 / (local_40 + 1.0);
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = std::__cxx11::stringstream::stringstream;
  __cxa_throw(puVar6,&std::bad_typeid::typeinfo,std::bad_typeid::~bad_typeid);
}

Assistant:

double WeightVectorPhrase::calcDistance(const Point* p) const
    {
        if (strcmp(typeid(*p).name(), typeid(*this).name()) != 0)
            throw std::bad_typeid();
        
        double metric = 0;
        for (uint32_t i = 0; i < getNumDimensions(); i++)
        {
            for (uint32_t j = 0; j < p->getNumDimensions(); j++)
            {
                std::unordered_map<std::string, std::unordered_map<std::string, double>>::const_iterator it_ext = m_Distances.find(getConcreteCoord(i));
                if (it_ext != m_Distances.end())
                {
                    std::unordered_map<std::string, double>::const_iterator it_int = it_ext->second.find(p->getConcreteCoord(j));
                    if (it_int != it_ext->second.end())
                        metric += it_int->second;
                }
            }
        }
        
        return 5.0 / (metric + 1.0); 
    }